

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O3

void __thiscall
SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  FileStore *pFVar1;
  SessionID sessionID;
  long *local_358;
  long local_350;
  long local_348 [2];
  long *local_338;
  long local_330;
  long local_328 [2];
  long *local_318;
  long local_310;
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  string local_2d8;
  FieldBase local_2b8;
  FieldBase local_258;
  FieldBase local_1f8;
  SessionID local_198;
  
  fileStoreFixture::fileStoreFixture((fileStoreFixture *)this,true,true);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"FIX.4.2","");
  local_1f8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00323d68;
  local_1f8.m_tag = 8;
  local_1f8.m_string._M_dataplus._M_p = (pointer)&local_1f8.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8.m_string,local_338,local_330 + (long)local_338);
  local_1f8.m_data._M_dataplus._M_p = (pointer)&local_1f8.m_data.field_2;
  local_1f8.m_data._M_string_length = 0;
  local_1f8.m_data.field_2._M_local_buf[0] = '\0';
  local_1f8.m_metrics.m_length = 0;
  local_1f8.m_metrics.m_checksum = 0;
  local_1f8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00324750;
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"SETGET","");
  local_258._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00323d68;
  local_258.m_tag = 0x31;
  local_258.m_string._M_dataplus._M_p = (pointer)&local_258.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258.m_string,local_358,local_350 + (long)local_358);
  local_258.m_data._M_dataplus._M_p = (pointer)&local_258.m_data.field_2;
  local_258.m_data._M_string_length = 0;
  local_258.m_data.field_2._M_local_buf[0] = '\0';
  local_258.m_metrics.m_length = 0;
  local_258.m_metrics.m_checksum = 0;
  local_258._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00324108;
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"TEST","");
  local_2b8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00323d68;
  local_2b8.m_tag = 0x38;
  local_2b8.m_string._M_dataplus._M_p = (pointer)&local_2b8.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8.m_string,local_318,local_310 + (long)local_318);
  local_2b8.m_data._M_dataplus._M_p = (pointer)&local_2b8.m_data.field_2;
  local_2b8.m_data._M_string_length = 0;
  local_2b8.m_data.field_2._M_local_buf[0] = '\0';
  local_2b8.m_metrics.m_length = 0;
  local_2b8.m_metrics.m_checksum = 0;
  local_2b8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00324980;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Test","");
  FIX::SessionID::SessionID
            (&local_198,&local_1f8.m_string,&local_258.m_string,&local_2b8.m_string,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_2b8);
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_258);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_1f8);
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  pFVar1 = (FileStore *)operator_new(0x130);
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"store","");
  FIX::FileStore::FileStore(pFVar1,local_2f8,&local_198);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_frozenString._M_dataplus._M_p != &local_198.m_frozenString.field_2) {
    operator_delete(local_198.m_frozenString._M_dataplus._M_p,
                    local_198.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_sessionQualifier._M_dataplus._M_p != &local_198.m_sessionQualifier.field_2) {
    operator_delete(local_198.m_sessionQualifier._M_dataplus._M_p,
                    local_198.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&local_198.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_198.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_198);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager() : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy( object );

    SessionID sessionID( BeginString( "FIX.4.2" ),
        SenderCompID( "SETGET" ), TargetCompID( "TEST" ), "Test" );

    object = new FileStore( "store", sessionID);
  }